

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLinOp.cpp
# Opt level: O2

void amrex::anon_unknown_1::MLNodeLinOp_set_dot_mask
               (MultiFab *dot_mask,iMultiFab *omask,Geometry *geom,
               GpuArray<amrex::LinOpBCType,_3U> *lobc,GpuArray<amrex::LinOpBCType,_3U> *hibc,
               CoarseningStrategy strategy)

{
  int *piVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int i;
  long lVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  double *pdVar15;
  long lVar16;
  ulong uVar17;
  int iVar18;
  int iVar22;
  int iVar23;
  int iVar24;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  int local_1dc;
  Array4<double> local_1a8;
  ulong local_168;
  long local_160;
  int local_158;
  int local_154;
  FabArray<amrex::FArrayBox> *local_150;
  Box bx;
  Box local_ec;
  Array4<const_int> local_d0;
  MFIter mfi;
  
  bx.smallend.vect._0_8_ = *(undefined8 *)(geom->domain).smallend.vect;
  uVar2 = *(undefined8 *)((geom->domain).smallend.vect + 2);
  bx.bigend.vect[1] = (int)((ulong)*(undefined8 *)(geom->domain).bigend.vect >> 0x20);
  bx._20_8_ = *(undefined8 *)((geom->domain).bigend.vect + 2);
  bx.smallend.vect[2] = (int)uVar2;
  bx.bigend.vect[0] = (int)((ulong)uVar2 >> 0x20);
  for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
    if ((bx.btype.itype >> ((uint)lVar5 & 0x1f) & 1) == 0) {
      piVar1 = bx.bigend.vect + lVar5;
      *piVar1 = *piVar1 + 1;
    }
  }
  if (strategy == Sigma) {
    local_1dc = bx.smallend.vect[1];
    iVar11 = bx.smallend.vect[0];
    iVar18 = bx.smallend.vect[2];
    iVar22 = bx.bigend.vect[0];
    iVar23 = bx.bigend.vect[1];
    iVar24 = bx.bigend.vect[2];
  }
  else {
    local_1dc = bx.smallend.vect[1] + -1000;
    iVar11 = bx.smallend.vect[0] + -1000;
    iVar18 = bx.smallend.vect[2] + -1000;
    iVar22 = bx.bigend.vect[0] + 1000;
    iVar23 = bx.bigend.vect[1] + 1000;
    iVar24 = bx.bigend.vect[2] + 1000;
  }
  local_150 = &dot_mask->super_FabArray<amrex::FArrayBox>;
  MFIter::MFIter(&mfi,(FabArrayBase *)dot_mask,true);
  local_158 = iVar22;
  local_154 = iVar11;
  while (mfi.currentIndex < mfi.endIndex) {
    MFIter::tilebox(&local_ec,&mfi);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_1a8,local_150,&mfi);
    FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
              (&local_d0,&omask->super_FabArray<amrex::IArrayBox>,&mfi);
    auVar4 = _DAT_006f8e90;
    auVar3 = _DAT_006f8e80;
    lVar7 = (long)local_ec.smallend.vect[1];
    lVar12 = (long)local_ec.bigend.vect[1];
    local_160 = (long)local_ec.bigend.vect[2];
    uVar6 = local_ec.bigend.vect[0] - local_ec.smallend.vect[0];
    local_168 = CONCAT44(0,uVar6);
    uVar13 = local_168 + 2 & 0xfffffffffffffffe;
    auVar27._4_4_ = 0;
    auVar27._0_4_ = uVar6;
    auVar27._8_4_ = uVar6;
    auVar27._12_4_ = 0;
    lVar8 = (long)local_ec.smallend.vect[0] * 8;
    lVar10 = (long)local_ec.smallend.vect[2];
    for (lVar5 = lVar10; (int)lVar5 <= local_ec.bigend.vect[2]; lVar5 = lVar5 + 1) {
      lVar14 = (long)local_d0.p +
               (lVar7 - local_d0.begin.y) * local_d0.jstride * 4 +
               (lVar5 - local_d0.begin.z) * local_d0.kstride * 4 + (long)local_d0.begin.x * -4 +
               (long)local_ec.smallend.vect[0] * 4 + 4;
      lVar16 = (long)local_1a8.p +
               (lVar7 - local_1a8.begin.y) * local_1a8.jstride * 8 +
               (lVar5 - local_1a8.begin.z) * local_1a8.kstride * 8 + (long)local_1a8.begin.x * -8 +
               lVar8 + 8;
      for (lVar9 = lVar7; lVar9 <= lVar12; lVar9 = lVar9 + 1) {
        if (local_ec.smallend.vect[0] <= local_ec.bigend.vect[0]) {
          uVar17 = 0;
          do {
            auVar25._8_4_ = (int)uVar17;
            auVar25._0_8_ = uVar17;
            auVar25._12_4_ = (int)(uVar17 >> 0x20);
            auVar31 = auVar27 ^ auVar4;
            auVar25 = (auVar25 | auVar3) ^ auVar4;
            if ((bool)(~(auVar25._4_4_ == auVar31._4_4_ && auVar31._0_4_ < auVar25._0_4_ ||
                        auVar31._4_4_ < auVar25._4_4_) & 1)) {
              *(double *)(lVar16 + -8 + uVar17 * 8) = (double)*(int *)(lVar14 + -4 + uVar17 * 4);
            }
            if (auVar25._12_4_ <= auVar31._12_4_ &&
                (auVar25._12_4_ != auVar31._12_4_ || auVar25._8_4_ <= auVar31._8_4_)) {
              *(double *)(lVar16 + uVar17 * 8) = (double)*(int *)(lVar14 + uVar17 * 4);
            }
            uVar17 = uVar17 + 2;
          } while (uVar13 != uVar17);
        }
        lVar14 = lVar14 + local_d0.jstride * 4;
        lVar16 = lVar16 + local_1a8.jstride * 8;
      }
    }
    if (((lobc->arr[0] == Neumann) || (lobc->arr[0] == inflow)) &&
       (lVar5 = lVar10, local_ec.smallend.vect[0] == local_154)) {
      for (; (int)lVar5 <= local_ec.bigend.vect[2]; lVar5 = lVar5 + 1) {
        pdVar15 = (double *)
                  ((long)local_1a8.p +
                  (lVar7 - local_1a8.begin.y) * local_1a8.jstride * 8 +
                  (lVar5 - local_1a8.begin.z) * local_1a8.kstride * 8 + (long)local_1a8.begin.x * -8
                  + (long)iVar11 * 8);
        for (lVar9 = lVar7; lVar9 <= lVar12; lVar9 = lVar9 + 1) {
          *pdVar15 = *pdVar15 * 0.5;
          pdVar15 = pdVar15 + local_1a8.jstride;
        }
      }
    }
    if (((hibc->arr[0] == inflow) || (hibc->arr[0] == Neumann)) &&
       (lVar5 = lVar10, local_ec.bigend.vect[0] == local_158)) {
      for (; (int)lVar5 <= local_ec.bigend.vect[2]; lVar5 = lVar5 + 1) {
        pdVar15 = (double *)
                  ((long)local_1a8.p +
                  (lVar7 - local_1a8.begin.y) * local_1a8.jstride * 8 +
                  (lVar5 - local_1a8.begin.z) * local_1a8.kstride * 8 + (long)local_1a8.begin.x * -8
                  + (long)iVar22 * 8);
        for (lVar9 = lVar7; lVar9 <= lVar12; lVar9 = lVar9 + 1) {
          *pdVar15 = *pdVar15 * 0.5;
          pdVar15 = pdVar15 + local_1a8.jstride;
        }
      }
    }
    if (((lobc->arr[1] == inflow) || (lobc->arr[1] == Neumann)) &&
       (local_ec.smallend.vect[1] == local_1dc)) {
      auVar31._8_4_ = uVar6;
      auVar31._0_8_ = local_168;
      auVar31._12_4_ = 0;
      lVar9 = (long)local_1a8.p +
              (lVar10 - local_1a8.begin.z) * local_1a8.kstride * 8 +
              (local_1dc - local_1a8.begin.y) * local_1a8.jstride * 8 + lVar8 +
              (long)local_1a8.begin.x * -8 + 8;
      auVar31 = auVar31 ^ auVar4;
      for (lVar5 = lVar10; lVar5 <= local_160; lVar5 = lVar5 + 1) {
        if (local_ec.smallend.vect[0] <= local_ec.bigend.vect[0]) {
          uVar17 = 0;
          do {
            auVar26._8_4_ = (int)uVar17;
            auVar26._0_8_ = uVar17;
            auVar26._12_4_ = (int)(uVar17 >> 0x20);
            auVar27 = (auVar26 | auVar3) ^ auVar4;
            if ((bool)(~(auVar31._4_4_ < auVar27._4_4_ ||
                        auVar31._0_4_ < auVar27._0_4_ && auVar27._4_4_ == auVar31._4_4_) & 1)) {
              *(double *)(lVar9 + -8 + uVar17 * 8) = *(double *)(lVar9 + -8 + uVar17 * 8) * 0.5;
            }
            if (auVar27._12_4_ <= auVar31._12_4_ &&
                (auVar27._8_4_ <= auVar31._8_4_ || auVar27._12_4_ != auVar31._12_4_)) {
              *(double *)(lVar9 + uVar17 * 8) = *(double *)(lVar9 + uVar17 * 8) * 0.5;
            }
            uVar17 = uVar17 + 2;
          } while (uVar13 != uVar17);
        }
        lVar9 = lVar9 + local_1a8.kstride * 8;
      }
    }
    if (((hibc->arr[1] == inflow) || (hibc->arr[1] == Neumann)) &&
       (local_ec.bigend.vect[1] == iVar23)) {
      auVar19._8_4_ = uVar6;
      auVar19._0_8_ = local_168;
      auVar19._12_4_ = 0;
      lVar5 = (long)local_1a8.p +
              (lVar10 - local_1a8.begin.z) * local_1a8.kstride * 8 +
              (iVar23 - local_1a8.begin.y) * local_1a8.jstride * 8 + lVar8 +
              (long)local_1a8.begin.x * -8 + 8;
      for (; lVar10 <= local_160; lVar10 = lVar10 + 1) {
        if (local_ec.smallend.vect[0] <= local_ec.bigend.vect[0]) {
          uVar17 = 0;
          do {
            auVar28._8_4_ = (int)uVar17;
            auVar28._0_8_ = uVar17;
            auVar28._12_4_ = (int)(uVar17 >> 0x20);
            auVar25 = auVar19 ^ auVar4;
            auVar27 = (auVar28 | auVar3) ^ auVar4;
            if ((bool)(~(auVar27._4_4_ == auVar25._4_4_ && auVar25._0_4_ < auVar27._0_4_ ||
                        auVar25._4_4_ < auVar27._4_4_) & 1)) {
              *(double *)(lVar5 + -8 + uVar17 * 8) = *(double *)(lVar5 + -8 + uVar17 * 8) * 0.5;
            }
            if (auVar27._12_4_ <= auVar25._12_4_ &&
                (auVar27._12_4_ != auVar25._12_4_ || auVar27._8_4_ <= auVar25._8_4_)) {
              *(double *)(lVar5 + uVar17 * 8) = *(double *)(lVar5 + uVar17 * 8) * 0.5;
            }
            uVar17 = uVar17 + 2;
          } while (uVar13 != uVar17);
        }
        lVar5 = lVar5 + local_1a8.kstride * 8;
      }
    }
    if (((lobc->arr[2] == Neumann) || (lobc->arr[2] == inflow)) &&
       (local_ec.smallend.vect[2] == iVar18)) {
      auVar20._8_4_ = uVar6;
      auVar20._0_8_ = local_168;
      auVar20._12_4_ = 0;
      lVar10 = (long)local_1a8.p +
               (lVar7 - local_1a8.begin.y) * local_1a8.jstride * 8 +
               (local_ec.smallend.vect[2] - local_1a8.begin.z) * local_1a8.kstride * 8 + lVar8 +
               (long)local_1a8.begin.x * -8 + 8;
      for (lVar5 = lVar7; lVar5 <= lVar12; lVar5 = lVar5 + 1) {
        if (local_ec.smallend.vect[0] <= local_ec.bigend.vect[0]) {
          uVar17 = 0;
          do {
            auVar29._8_4_ = (int)uVar17;
            auVar29._0_8_ = uVar17;
            auVar29._12_4_ = (int)(uVar17 >> 0x20);
            auVar25 = auVar20 ^ auVar4;
            auVar27 = (auVar29 | auVar3) ^ auVar4;
            if ((bool)(~(auVar27._4_4_ == auVar25._4_4_ && auVar25._0_4_ < auVar27._0_4_ ||
                        auVar25._4_4_ < auVar27._4_4_) & 1)) {
              *(double *)(lVar10 + -8 + uVar17 * 8) = *(double *)(lVar10 + -8 + uVar17 * 8) * 0.5;
            }
            if (auVar27._12_4_ <= auVar25._12_4_ &&
                (auVar27._12_4_ != auVar25._12_4_ || auVar27._8_4_ <= auVar25._8_4_)) {
              *(double *)(lVar10 + uVar17 * 8) = *(double *)(lVar10 + uVar17 * 8) * 0.5;
            }
            uVar17 = uVar17 + 2;
          } while (uVar13 != uVar17);
        }
        lVar10 = lVar10 + local_1a8.jstride * 8;
      }
    }
    if (((hibc->arr[2] == Neumann) || (hibc->arr[2] == inflow)) &&
       (local_ec.bigend.vect[2] == iVar24)) {
      auVar21._8_4_ = uVar6;
      auVar21._0_8_ = local_168;
      auVar21._12_4_ = 0;
      lVar5 = (long)local_1a8.p +
              (lVar7 - local_1a8.begin.y) * local_1a8.jstride * 8 +
              (local_ec.bigend.vect[2] - local_1a8.begin.z) * local_1a8.kstride * 8 + lVar8 +
              (long)local_1a8.begin.x * -8 + 8;
      for (; lVar7 <= lVar12; lVar7 = lVar7 + 1) {
        if (local_ec.smallend.vect[0] <= local_ec.bigend.vect[0]) {
          uVar17 = 0;
          do {
            auVar30._8_4_ = (int)uVar17;
            auVar30._0_8_ = uVar17;
            auVar30._12_4_ = (int)(uVar17 >> 0x20);
            auVar25 = auVar21 ^ auVar4;
            auVar27 = (auVar30 | auVar3) ^ auVar4;
            if ((bool)(~(auVar27._4_4_ == auVar25._4_4_ && auVar25._0_4_ < auVar27._0_4_ ||
                        auVar25._4_4_ < auVar27._4_4_) & 1)) {
              *(double *)(lVar5 + -8 + uVar17 * 8) = *(double *)(lVar5 + -8 + uVar17 * 8) * 0.5;
            }
            if (auVar27._12_4_ <= auVar25._12_4_ &&
                (auVar27._12_4_ != auVar25._12_4_ || auVar27._8_4_ <= auVar25._8_4_)) {
              *(double *)(lVar5 + uVar17 * 8) = *(double *)(lVar5 + uVar17 * 8) * 0.5;
            }
            uVar17 = uVar17 + 2;
          } while (uVar13 != uVar17);
        }
        lVar5 = lVar5 + local_1a8.jstride * 8;
      }
    }
    MFIter::operator++(&mfi);
  }
  MFIter::~MFIter(&mfi);
  return;
}

Assistant:

void MLNodeLinOp_set_dot_mask (MultiFab& dot_mask, iMultiFab const& omask, Geometry const& geom,
                               GpuArray<LinOpBCType,AMREX_SPACEDIM> const& lobc,
                               GpuArray<LinOpBCType,AMREX_SPACEDIM> const& hibc,
                               MLNodeLinOp::CoarseningStrategy strategy)
{
    Box nddomain = amrex::surroundingNodes(geom.Domain());

    if (strategy != MLNodeLinOp::CoarseningStrategy::Sigma) {
        nddomain.grow(1000); // hack to avoid masks being modified at Neuman boundary
    }

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(dot_mask,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        Array4<Real> const& dfab = dot_mask.array(mfi);
        Array4<int const> const& sfab = omask.const_array(mfi);
        AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( bx, tbx,
        {
            mlndlap_set_dot_mask(tbx, dfab, sfab, nddomain, lobc, hibc);
        });
    }
}